

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O3

void on_read1(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_write_t *req;
  uv_stream_t *unaff_RBX;
  uv_loop_t *cb;
  uv__queue *puVar2;
  uv_stream_t *handle;
  uv_close_cb *__ptr;
  uv_handle_t *puVar3;
  undefined1 *__ptr_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_90 [56];
  code *pcStack_58;
  undefined8 uStack_48;
  uv_close_cb p_Stack_40;
  uv_buf_t uStack_38;
  uv_stream_t *puStack_28;
  undefined1 local_18 [8];
  void *local_10;
  
  cb = (uv_loop_t *)local_18;
  local_18 = (undefined1  [8])0x0;
  local_10 = (void *)nread;
  if (nread < 0) {
    on_read1_cold_3();
  }
  else {
    do_write(stream,on_write);
    iVar1 = uv_read_stop(stream);
    local_10 = (void *)(long)iVar1;
    local_18 = (undefined1  [8])0x0;
    unaff_RBX = stream;
    if (local_10 == (void *)0x0) {
      iVar1 = uv_read_start(stream,on_alloc,on_read2);
      local_10 = (void *)(long)iVar1;
      local_18 = (undefined1  [8])0x0;
      if (local_10 == (void *)0x0) {
        read_cb_called = read_cb_called + 1;
        return;
      }
      goto LAB_001caf50;
    }
  }
  on_read1_cold_1();
LAB_001caf50:
  handle = (uv_stream_t *)&stack0xfffffffffffffff0;
  on_read1_cold_2();
  pcStack_58 = (code *)0x1caf74;
  puStack_28 = unaff_RBX;
  req = (uv_write_t *)malloc(200);
  uStack_38.base = "1234578";
  uStack_38.len = 8;
  pcStack_58 = (code *)0x1caf9e;
  iVar1 = uv_write(req,handle,&uStack_38,1,(uv_write_cb)cb);
  p_Stack_40 = (uv_close_cb)(long)iVar1;
  uStack_48._0_4_ = UV_UNKNOWN_HANDLE;
  uStack_48._4_4_ = 0;
  if (p_Stack_40 == (uv_close_cb)0x0) {
    return;
  }
  __ptr = &p_Stack_40;
  iVar1 = (int)&uStack_48;
  pcStack_58 = on_write;
  do_write_cold_1();
  pcStack_58 = (code *)(long)iVar1;
  auStack_90._48_8_ = (uv_handle_t *)0x0;
  if (pcStack_58 == (code *)0x0) {
    free(__ptr);
    return;
  }
  puVar3 = (uv_handle_t *)&pcStack_58;
  puVar2 = (uv__queue *)(auStack_90 + 0x30);
  auStack_90._32_8_ = on_read2;
  on_write_cold_1();
  auStack_90._24_8_ = (uv_close_cb)0x0;
  auStack_90._32_8_ = puVar2;
  if ((long)puVar2 < 0) {
    auStack_90._8_8_ = (uv_loop_t *)0x1cb02f;
    uv_close(puVar3,(uv_close_cb)0x0);
    auStack_90._8_8_ = (uv_loop_t *)0x1cb03d;
    uv_close((uv_handle_t *)&server,(uv_close_cb)0x0);
    read_cb_called = read_cb_called + 1;
    return;
  }
  __ptr_00 = auStack_90 + 0x20;
  iVar1 = (int)auStack_90 + 0x18;
  auStack_90._8_8_ = on_write_close_immediately;
  on_read2_cold_1();
  auStack_90._0_8_ = SEXT48(iVar1);
  auStack_90._8_8_ = cb;
  if ((void *)auStack_90._0_8_ == (void *)0x0) {
    uv_close(*(uv_handle_t **)(__ptr_00 + 0x58),(uv_close_cb)0x0);
    free(__ptr_00);
    return;
  }
  puVar3 = (uv_handle_t *)auStack_90;
  on_write_close_immediately_cold_1();
  iVar1 = uv_is_closing(puVar3);
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar3,(uv_close_cb)0x0);
  return;
}

Assistant:

static void on_read1(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT_GE(nread, 0);

  /* Do write on a half open connection to force WSAECONNABORTED (on Windows)
   * in the subsequent uv_read_start()
   */
  do_write(stream, on_write);

  ASSERT_OK(uv_read_stop(stream));

  ASSERT_OK(uv_read_start(stream, on_alloc, on_read2));

  read_cb_called++;
}